

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ShowVarsTask::checkArguments
          (ShowVarsTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  iterator iVar2;
  iterator this_01;
  reference ppEVar3;
  SourceLocation SVar4;
  Type *pTVar5;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  undefined8 in_R9;
  undefined1 isMethod;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  Symbol *sym;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  Args *__range3;
  Compilation *comp;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *this_02;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  *__lhs;
  undefined4 in_stack_ffffffffffffff80;
  Expression *pEVar6;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_R9 >> 0x38);
  SVar4 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0xb347db);
  this_02 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x0;
  __lhs = (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
           *)0x7fffffff;
  callRange.endLoc = in_RCX;
  callRange.startLoc = SVar4;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,(bool)isMethod,(Args *)this_00,callRange,unaff_retaddr,
                     in_stack_00000008);
  if (bVar1) {
    iVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin(this_02);
    this_01 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI
                        );
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             (__lhs,(__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)this_02), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)&stack0xffffffffffffffa0);
      pEVar6 = *ppEVar3;
      SVar4 = (SourceLocation)
              Expression::getSymbolReference
                        ((Expression *)in_RDX,SUB81((ulong)iVar2._M_current >> 0x38,0));
      if ((SVar4 == (SourceLocation)0x0) || ((*(int *)SVar4 != 0x3c && (*(int *)SVar4 != 0x3b)))) {
        not_null<const_slang::ast::Scope_*>::operator->
                  ((not_null<const_slang::ast::Scope_*> *)0xb348dc);
        bVar1 = Scope::isUninstantiated((Scope *)this_01._M_current);
        if (!bVar1) {
          sourceRange.startLoc._4_4_ = 0xf000b;
          sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff80;
          sourceRange.endLoc = SVar4;
          ASTContext::addDiag((ASTContext *)(pEVar6->sourceRange).endLoc,
                              SUB84((ulong)pEVar6 >> 0x20,0),sourceRange);
        }
        pTVar5 = Compilation::getErrorType(this_00);
        return pTVar5;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffffa0);
    }
    local_8 = Compilation::getVoidType(this_00);
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        for (auto arg : args) {
            auto sym = arg->getSymbolReference();
            if (!sym || (sym->kind != SymbolKind::Variable && sym->kind != SymbolKind::Net)) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedVariableName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }